

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessConstantBuffer
          (ConversionStream *this,iterator *Token)

{
  TokenListType *this_00;
  _List_node_base *p_Var1;
  const_iterator __position;
  int iVar2;
  _List_node_base *p_Var3;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Var4;
  char (*in_RCX) [37];
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_1;
  iterator CurrToken;
  string msg;
  String local_e0;
  undefined1 local_c0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  size_t local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  p_Var3 = Token->_M_node;
  if (*(int *)&p_Var3[1]._M_next != 0xd1) {
    FormatString<char[26],char[37]>
              ((string *)local_c0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::kw_cbuffer",in_RCX);
    DebugAssertionFailed
              ((Char *)local_c0._0_8_,"ProcessConstantBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x395);
    if ((_List_node_base *)local_c0._0_8_ != (_List_node_base *)(local_c0 + 0x10)) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    p_Var3 = Token->_M_node;
  }
  pcVar5 = "uniform";
  if (this->m_bUseRowMajorMatrices != false) {
    pcVar5 = "layout(row_major) uniform";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&p_Var3[1]._M_prev,0,(char *)p_Var3[2]._M_next,(ulong)pcVar5);
  p_Var3 = Token->_M_node->_M_next;
  Token->_M_node = p_Var3;
  this_00 = &this->m_Tokens;
  if (p_Var3 == (_List_node_base *)this_00) {
    FormatString<char[39]>
              ((string *)local_c0,(char (*) [39])"Unexpected EOF after \"cbuffer\" keyword");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&local_e0,this,Token,4)
    ;
    pcVar5 = (char *)0x39f;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessConstantBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x39f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (char (*) [2])0x82ea05,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((_List_node_base *)local_c0._0_8_ != (_List_node_base *)(local_c0 + 0x10)) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    p_Var3 = Token->_M_node;
  }
  if (*(int *)&p_Var3[1]._M_next != 0x13b) {
    FormatString<char[44]>
              ((string *)local_c0,(char (*) [44])"Identifier expected after \"cbuffer\" keyword");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&local_e0,this,Token,4)
    ;
    pcVar5 = (char *)0x3a0;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessConstantBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (char (*) [2])0x82ea05,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((_List_node_base *)local_c0._0_8_ != (_List_node_base *)(local_c0 + 0x10)) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    p_Var3 = Token->_M_node;
  }
  p_Var1 = p_Var3->_M_next;
  Token->_M_node = p_Var1;
  iVar2 = std::__cxx11::string::compare((char *)&p_Var1[1]._M_prev);
  _Var4._M_node = Token->_M_node;
  Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71((int7)((ulong)pcVar5 >> 8),
                    _Var4._M_node == (_List_node_base *)this_00 || iVar2 != 0);
  if (_Var4._M_node != (_List_node_base *)this_00 && iVar2 == 0) {
    do {
      if (*(int *)&_Var4._M_node[1]._M_next == 0x133) break;
      Token->_M_node = (_Var4._M_node)->_M_next;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      _M_erase(this_00,(iterator)_Var4._M_node);
      _Var4._M_node = Token->_M_node;
    } while (_Var4._M_node != (_List_node_base *)this_00);
  }
  while (_Var4._M_node != (_List_node_base *)this_00) {
    if (*(int *)&_Var4._M_node[1]._M_next == 0x133) goto LAB_0037761e;
    _Var4._M_node = (_Var4._M_node)->_M_next;
    Token->_M_node = _Var4._M_node;
  }
  FormatString<char[49],std::__cxx11::string>
            ((string *)local_c0,(Diligent *)"Missing open brace in the definition of cbuffer ",
             (char (*) [49])&p_Var3[1]._M_prev,Args_1);
  PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&local_e0,this,Token,4);
  Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3bb;
  LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
            (false,"ProcessConstantBuffer",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
             ,0x3bb,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
             (char (*) [2])0x82ea05,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((_List_node_base *)local_c0._0_8_ != (_List_node_base *)(local_c0 + 0x10)) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  _Var4._M_node = Token->_M_node;
LAB_0037761e:
  local_c0._0_8_ =
       (this_00->
       super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
       )._M_impl._M_node.super__List_node_base._M_next;
  local_e0._M_dataplus._M_p = (pointer)this_00;
  _Var4 = Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)local_c0,
                     (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&local_e0,_Var4);
  Token->_M_node = _Var4._M_node;
  if (_Var4._M_node == (_List_node_base *)this_00) {
    FormatString<char[62],std::__cxx11::string>
              ((string *)local_c0,
               (Diligent *)"No matching closing brace found in the definition of cbuffer ",
               (char (*) [62])&p_Var3[1]._M_prev,Args_1);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&local_e0,this,Token,4)
    ;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessConstantBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3bf,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (char (*) [2])0x82ea05,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((_List_node_base *)local_c0._0_8_ != (_List_node_base *)(local_c0 + 0x10)) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    _Var4._M_node = Token->_M_node;
  }
  __position._M_node = (_Var4._M_node)->_M_next;
  Token->_M_node = __position._M_node;
  if ((__position._M_node == (_List_node_base *)this_00) ||
     (*(int *)&__position._M_node[1]._M_next != 0x13e)) {
    local_50 = &local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,";","");
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    local_c0._0_4_ = 0x13e;
    if (local_50 == &local_40) {
      local_a8._8_8_ = local_40._8_8_;
      local_c0._8_8_ = &local_a8;
    }
    else {
      local_c0._8_8_ = local_50;
    }
    local_a8._M_allocated_capacity._1_7_ = local_40._M_allocated_capacity._1_7_;
    local_a8._M_local_buf[0] = local_40._M_local_buf[0];
    local_c0._16_8_ = local_48;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    if (local_70 == &local_60) {
      local_88._8_8_ = local_60._8_8_;
      local_98._M_p = (pointer)&local_88;
    }
    else {
      local_98._M_p = (pointer)local_70;
    }
    local_88._M_allocated_capacity._1_7_ = local_60._M_allocated_capacity._1_7_;
    local_88._M_local_buf[0] = local_60._M_local_buf[0];
    local_90 = local_68;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_78 = 0xffffffffffffffff;
    local_70 = &local_60;
    local_50 = &local_40;
    std::__cxx11::
    list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
    emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,__position,(HLSLTokenInfo *)local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._8_8_ != &local_a8) {
      operator_delete((void *)local_c0._8_8_,local_a8._0_8_ + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(local_60._M_allocated_capacity._1_7_,
                                        local_60._M_local_buf[0]) + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(local_40._M_allocated_capacity._1_7_,
                                        local_40._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessConstantBuffer(TokenListType::iterator& Token)
{
    VERIFY_EXPR(Token->Type == TokenType::kw_cbuffer);

    // Replace "cbuffer" with "uniform"
    Token->Literal = m_bUseRowMajorMatrices ?
        "layout(row_major) uniform" :
        "uniform";
    ++Token;
    // cbuffer CBufferName
    //         ^

    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF after \"cbuffer\" keyword");
    VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Identifier expected after \"cbuffer\" keyword");
    const auto& CBufferName = Token->Literal;

    ++Token;
    // cbuffer CBufferName
    //                    ^
    if (Token->Literal == ":")
    {
        // cbuffer CBufferName : register(b0) {
        //                     ^

        // Remove register
        while (Token != m_Tokens.end() && Token->Type != TokenType::OpenBrace)
        {
            auto CurrToken = Token;
            ++Token;
            m_Tokens.erase(CurrToken);
        }
        // cbuffer CBufferName {
        //                     ^
    }

    while (Token != m_Tokens.end() && Token->Type != TokenType::OpenBrace)
        ++Token;
    // cbuffer CBufferName
    // {
    // ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Missing open brace in the definition of cbuffer ", CBufferName);

    // Find closing brace
    Token = Parsing::FindMatchingBracket(m_Tokens.begin(), m_Tokens.end(), Token);
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "No matching closing brace found in the definition of cbuffer ", CBufferName);

    ++Token; // Skip closing brace
    // cbuffer CBufferName
    // {
    //    ...
    // }
    // int a
    // ^

    if (Token == m_Tokens.end() || Token->Type != TokenType::Semicolon)
    {
        m_Tokens.insert(Token, TokenInfo(TokenType::Semicolon, ";"));
        // cbuffer CBufferName
        // {
        //    ...
        // };
        // int a;
        // ^
    }
}